

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

void google::protobuf::compiler::ruby::GenerateEnumAssignment
               (string *prefix,EnumDescriptor *en,Printer *printer)

{
  string local_40;
  
  RubifyConstant(&local_40,*(string **)en);
  io::Printer::Print(printer,"$prefix$$name$ = ","prefix",prefix,"name",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Print(printer,
                     "Google::Protobuf::DescriptorPool.generated_pool.lookup(\"$full_name$\").enummodule\n"
                     ,"full_name",*(string **)(en + 8));
  return;
}

Assistant:

void GenerateEnumAssignment(
    const std::string& prefix,
    const google::protobuf::EnumDescriptor* en,
    google::protobuf::io::Printer* printer) {
  printer->Print(
    "$prefix$$name$ = ",
    "prefix", prefix,
    "name", RubifyConstant(en->name()));
  printer->Print(
    "Google::Protobuf::DescriptorPool.generated_pool."
    "lookup(\"$full_name$\").enummodule\n",
    "full_name", en->full_name());
}